

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt32emu-smf2wav.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  gchar *pgVar3;
  gchar *pgVar4;
  int iVar5;
  uint uVar6;
  DACInputMode DVar7;
  mt32emu_return_code mVar8;
  int iVar9;
  Bit32u BVar10;
  char *pcVar11;
  char *pcVar12;
  undefined8 uVar13;
  gchar **ppgVar14;
  size_t sVar15;
  GDir *romDir;
  char *__s;
  char *filename;
  size_t sVar16;
  char **ppcVar17;
  FILE *pFVar18;
  clock_t cVar19;
  gchar *pgVar20;
  smf_t *smf;
  smf_event_t *event;
  Bit8u *__dest;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int i_1;
  uchar channel;
  Bit32u len;
  size_t sVar24;
  uint uVar25;
  Bit32u BVar26;
  gsize i;
  long lVar27;
  gchar *pgVar28;
  Bit32u BVar29;
  ulong uVar30;
  uchar *sysex;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  Service service;
  Bit8u *local_6d0;
  size_t local_6c8;
  int local_6b4;
  char **local_6b0;
  gchar *deprecatedSysexFile;
  gchar **rawStreams;
  char *local_698;
  char **local_690;
  gint outputSampleFormat;
  gint srcQualityIx;
  gint rendererTypeIx;
  gint analogOutputModeIx;
  gint dacInputModeIx;
  undefined8 local_670;
  Options local_668;
  FILE *local_5c8;
  gchar **local_5c0;
  gint renderMaxFrames;
  gint renderMinFrames;
  gint bufferFrameCount;
  gint partialCount;
  int local_5a4;
  char *local_5a0;
  char *local_598;
  clock_t local_590;
  char *local_588;
  long local_580;
  mt32emu_rom_info rom_info;
  
  service.c = (mt32emu_context)0x0;
  setlocale(6,"");
  pcVar11 = mt32emu_get_library_version_string();
  printf("Munt MT32Emu MIDI to Wave Conversion Utility. Version %s\n","1.9.0");
  puts("  Copyright (C) 2009, 2011 Jerome Fisher <re_munt@kingguppy.com>");
  puts("  Copyright (C) 2012-2022 Jerome Fisher, Sergey V. Mikayev");
  pcVar12 = smf_get_version();
  printf("Using Munt MT32Emu Library Version %s, libsmf Version %s (with modifications)\n",pcVar11,
         pcVar12);
  dacInputModeIx = 0;
  analogOutputModeIx = 0;
  ppgVar14 = &local_668.outputFilename;
  rom_info.control_rom_id = "output";
  rom_info.control_rom_description._0_1_ = 0x6f;
  rom_info.control_rom_description._4_4_ = 0;
  rom_info.control_rom_sha1_digest._0_4_ = 4;
  rom_info.pcm_rom_id._0_1_ = SUB81(ppgVar14,0);
  rom_info.pcm_rom_id._1_1_ = (undefined1)((ulong)ppgVar14 >> 8);
  rom_info.pcm_rom_id._2_1_ = (undefined1)((ulong)ppgVar14 >> 0x10);
  rom_info.pcm_rom_id._3_1_ = (undefined1)((ulong)ppgVar14 >> 0x18);
  rom_info.pcm_rom_id._4_1_ = (undefined1)((ulong)ppgVar14 >> 0x20);
  rom_info.pcm_rom_id._5_1_ = (undefined1)((ulong)ppgVar14 >> 0x28);
  rom_info.pcm_rom_id._6_1_ = (undefined1)((ulong)ppgVar14 >> 0x30);
  rom_info.pcm_rom_id._7_1_ = (undefined1)((ulong)ppgVar14 >> 0x38);
  rom_info.pcm_rom_description._0_1_ = 0x13;
  rom_info.pcm_rom_description._1_1_ = 0xf2;
  rom_info.pcm_rom_description._2_1_ = 0x11;
  rom_info.pcm_rom_description._3_1_ = 0;
  rom_info.pcm_rom_description._4_4_ = 0;
  rom_info.pcm_rom_sha1_digest._0_4_ = 0x11f255;
  rom_info.pcm_rom_sha1_digest._4_4_ = 0;
  rendererTypeIx = 0;
  outputSampleFormat = 0;
  renderMinFrames = 0;
  renderMaxFrames = -1;
  rawStreams = (gchar **)0x0;
  srcQualityIx = SamplerateConversionQuality_GOOD;
  local_668.rendererType = RendererType_BIT16S;
  local_668.force = 0;
  local_668.quiet = 0;
  local_668.romDir = (char *)0x0;
  local_668.machineID = (char *)0x0;
  local_668.inputFilenames = (gchar **)0x0;
  local_668.outputFilename = (char *)0x0;
  local_668.rawChannelCount = 0;
  local_668.sampleRate = 0;
  local_668.outputSampleFormat = OUTPUT_SAMPLE_FORMAT_SINT16;
  local_668.dacInputMode = DACInputMode_NICE;
  local_668.analogOutputMode = AnalogOutputMode_DIGITAL_ONLY;
  local_668.recordMaxStartSilentFrames = 0;
  local_668.recordMaxEndSilentFrames = 0;
  local_668.recordMaxLA32EndSilentFrames = 0;
  local_668.waitForLA32 = 1;
  local_668.waitForReverb = 1;
  local_668.sendAllNotesOff = 1;
  local_668.niceAmpRamp = 1;
  local_668.nicePanning = 0;
  local_668.nicePartialMixing = 0;
  partialCount = 0x20;
  bufferFrameCount = 0x20000;
  deprecatedSysexFile = (gchar *)0x0;
  local_690 = argv;
  local_668.srcQuality = srcQualityIx;
  local_5a4 = argc;
  uVar13 = g_option_context_new("- record MIDI played through the MT-32 emulator to a file");
  g_option_context_add_main_entries(uVar13,&rom_info,0);
  local_580 = 0;
  iVar5 = g_option_context_parse(uVar13,&local_5a4,&local_690);
  if (iVar5 == 0) {
    fprintf(_stderr,"Option parsing failed: %s\n",*(undefined8 *)(local_580 + 8));
  }
  bVar31 = 3 < (uint)analogOutputModeIx;
  if (bVar31) {
    fwrite("analog-output-mode must be between 0 and 3\n",0x2b,1,_stderr);
  }
  bVar32 = 1 < (uint)rendererTypeIx;
  if (bVar32) {
    fwrite("renderer-type must be either 0 or 1\n",0x24,1,_stderr);
  }
  bVar33 = 1 < (uint)outputSampleFormat;
  if (bVar33) {
    fwrite("output-sample-format must be either 0 or 1\n",0x2b,1,_stderr);
  }
  bVar34 = 3 < (uint)srcQualityIx;
  if (bVar34) {
    fwrite("src-quality must be between 0 and 3\n",0x24,1,_stderr);
  }
  bVar35 = 3 < (uint)dacInputModeIx;
  if (bVar35) {
    fwrite("dac-input-mode must be between 0 and 3\n",0x27,1,_stderr);
  }
  bVar2 = bufferFrameCount < 1;
  if (bVar2) {
    fwrite("buffer-size must be greater than 0\n",0x23,1,_stderr);
  }
  else {
    local_668.bufferFrameCount = bufferFrameCount;
  }
  bVar31 = !bVar2 && (!bVar35 && (!bVar34 && (!bVar33 && (!bVar32 && (!bVar31 && iVar5 != 0)))));
  local_668.partialCount = 8;
  if (8 < partialCount) {
    local_668.partialCount = partialCount;
  }
  local_668.renderMaxFrames = 0x7fffffff;
  if ((uint)renderMaxFrames < 0x7fffffff) {
    local_668.renderMaxFrames = renderMaxFrames;
  }
  local_668.renderMinFrames = 0;
  if (0 < renderMinFrames) {
    local_668.renderMinFrames = renderMinFrames;
  }
  if ((int)local_668.renderMaxFrames < renderMinFrames) {
    local_668.renderMinFrames = local_668.renderMaxFrames;
  }
  if (local_668.recordMaxStartSilentFrames < 0) {
    local_668.recordMaxStartSilentFrames = 0x7fffffff;
  }
  if (local_668.recordMaxEndSilentFrames < 0) {
    local_668.recordMaxEndSilentFrames = 0x7fffffff;
  }
  if (local_668.recordMaxLA32EndSilentFrames < 0) {
    local_668.recordMaxLA32EndSilentFrames = 0x7fffffff;
  }
  if ((rawStreams != (gchar **)0x0) && (iVar5 = g_strv_length(), ppgVar14 = rawStreams, iVar5 != 0))
  {
    for (; pcVar11 = *ppgVar14, pcVar11 != (char *)0x0; ppgVar14 = ppgVar14 + 1) {
      lVar27 = (long)local_668.rawChannelCount;
      if (lVar27 == 8) {
        fwrite("Too many raw-stream options - maximum 8\n",0x28,1,_stderr);
        bVar31 = false;
        break;
      }
      iVar5 = atoi(pcVar11);
      local_668.rawChannelMap[lVar27] = iVar5;
      if (local_668.rawChannelMap[local_668.rawChannelCount] - 6U < 0xfffffff9) {
        bVar31 = false;
        fprintf(_stderr,
                "Invalid option raw-stream option %s - must be a number between -1 and 5 (inclusive)\n"
                ,pcVar11);
        break;
      }
      local_668.rawChannelCount = local_668.rawChannelCount + 1;
    }
  }
  if (deprecatedSysexFile == (gchar *)0x0) {
    if (local_668.inputFilenames != (gchar **)0x0) goto LAB_00109375;
LAB_00109aa3:
    fwrite("No input files specified\n",0x19,1,_stderr);
    bVar31 = false;
  }
  else {
    if (local_668.inputFilenames == (gchar **)0x0) {
      uVar30 = 0;
    }
    else {
      uVar6 = g_strv_length(local_668.inputFilenames);
      uVar30 = (ulong)uVar6;
    }
    ppgVar14 = (gchar **)g_malloc_n((int)uVar30 + 2);
    *ppgVar14 = deprecatedSysexFile;
    ppgVar14[(int)uVar30 + 1] = (gchar *)0x0;
    for (uVar22 = 0; uVar30 != uVar22; uVar22 = uVar22 + 1) {
      ppgVar14[uVar22 + 1] = local_668.inputFilenames[uVar22];
    }
    g_free();
    local_668.inputFilenames = ppgVar14;
LAB_00109375:
    iVar5 = g_strv_length(local_668.inputFilenames);
    if (iVar5 == 0) goto LAB_00109aa3;
  }
  local_668.analogOutputMode = SRC_QUALITIES[analogOutputModeIx];
  local_668.rendererType = RENDERER_TYPES[rendererTypeIx];
  local_668.outputSampleFormat = outputSampleFormat;
  local_668.srcQuality = SRC_QUALITIES[srcQualityIx];
  g_strfreev(rawStreams);
  if (local_668.rawChannelCount < 1) {
    DVar7 = SRC_QUALITIES[dacInputModeIx];
  }
  else {
    local_668.dacInputMode = DACInputMode_NICE;
    local_668.analogOutputMode = AnalogOutputMode_DIGITAL_ONLY;
    local_668.sampleRate = 0;
    DVar7 = DACInputMode_PURE;
  }
  local_668.dacInputMode = DVar7;
  if (!bVar31) {
    pcVar11 = (char *)g_option_context_get_help(uVar13,1,0);
    fputs(pcVar11,_stderr);
    freeOptions(&local_668);
  }
  g_option_context_free(uVar13);
  ppgVar14 = local_668.inputFilenames;
  if (!bVar31) {
    local_6b4 = -1;
    goto LAB_0010a424;
  }
  local_698 = local_668.outputFilename;
  if (local_668.outputFilename == (char *)0x0) {
    iVar5 = g_strv_length(local_668.inputFilenames);
    pcVar11 = ppgVar14[iVar5 - 1];
    sVar15 = strlen(pcVar11);
    local_698 = (char *)operator_new__(sVar15 + 5);
    pcVar12 = "%s.wav";
    if (0 < local_668.rawChannelCount) {
      pcVar12 = "%s.raw";
    }
    sprintf(local_698,pcVar12,pcVar11);
  }
  MT32Emu::Service::createContext(&service,(mt32emu_report_handler_i)0x0,(void *)0x0);
  pcVar11 = ".";
  if (local_668.romDir != (char *)0x0) {
    pcVar11 = local_668.romDir;
  }
  sVar15 = strlen(pcVar11);
  pcVar11 = (char *)g_filename_from_utf8(pcVar11,sVar15,0,0);
  romDir = (GDir *)g_dir_open(pcVar11,0,0);
  pgVar20 = local_668.machineID;
  local_6b4 = 1;
  if (romDir == (GDir *)0x0) {
    fwrite("Error reading contents of ROM dir.\n",0x23,1,_stderr);
    g_free(pcVar11);
  }
  else {
    bVar31 = true;
    if ((local_668.machineID == (char *)0x0) ||
       (iVar5 = strcmp(local_668.machineID,"any"), iVar5 == 0)) {
LAB_0010955d:
      local_6c8 = mt32emu_get_machine_ids((char **)0x0,0);
      uVar30 = -(ulong)(local_6c8 >> 0x3d != 0) | local_6c8 * 8;
      local_6b0 = (char **)operator_new__(uVar30);
      mt32emu_get_machine_ids(local_6b0,local_6c8);
      if (!bVar31) {
        ppcVar17 = (char **)operator_new__(uVar30);
        uVar6 = 0;
        sVar16 = 0;
        while( true ) {
          if (local_6c8 <= uVar6) break;
          pcVar12 = local_6b0[uVar6];
          iVar5 = strncmp(pgVar20,pcVar12,4);
          sVar24 = sVar16;
          if (iVar5 == 0) {
            sVar24 = (size_t)((int)sVar16 + 1);
            ppcVar17[sVar16] = pcVar12;
          }
          uVar6 = uVar6 + 1;
          sVar16 = sVar24;
        }
        operator_delete__(local_6b0);
        local_6c8 = sVar16;
        local_6b0 = ppcVar17;
      }
      uVar13 = g_hash_table_new(0);
      while (lVar27 = g_dir_read_name(), lVar27 != 0) {
        pcVar12 = (char *)g_build_filename(pcVar11,lVar27,0);
        sVar15 = strlen(pcVar12);
        __s = (char *)g_filename_to_utf8(pcVar12,sVar15,0,0);
        sVar15 = strlen(__s);
        filename = (char *)g_locale_from_utf8(__s,sVar15,0,0);
        mVar8 = mt32emu_identify_rom_file(&rom_info,filename,(char *)0x0);
        if (rom_info.control_rom_id != (char *)0x0 && mVar8 == MT32EMU_RC_OK) {
          g_hash_table_add(uVar13);
        }
        g_free(filename);
        g_free(__s);
        g_free(pcVar12);
      }
      bVar31 = false;
      while (bVar31 == false) {
        bVar32 = local_6c8 == 0;
        local_6c8 = local_6c8 - 1;
        if (bVar32) {
          g_hash_table_destroy(uVar13);
          fwrite("ROMs not found for machine configuration.\n",0x2a,1,_stderr);
          goto LAB_0010978e;
        }
        pcVar12 = local_6b0[local_6c8];
        sVar16 = mt32emu_get_rom_ids((char **)0x0,0,pcVar12);
        uVar30 = sVar16 * 8;
        if (0x1fffffffffffffff < sVar16) {
          uVar30 = 0xffffffffffffffff;
        }
        ppcVar17 = (char **)operator_new__(uVar30);
        mt32emu_get_rom_ids(ppcVar17,sVar16,pcVar12);
        for (uVar6 = 0; bVar31 = uVar6 < sVar16, uVar6 < sVar16; uVar6 = uVar6 + 1) {
          iVar5 = g_hash_table_contains(uVar13);
          if (iVar5 != 0) {
            g_dir_rewind(romDir);
            bVar32 = loadMachineROMs(&service,pcVar11,romDir,pcVar12,false);
            if (bVar32) break;
          }
        }
        operator_delete__(ppcVar17);
      }
      g_hash_table_destroy(uVar13);
LAB_0010978e:
      operator_delete__(local_6b0);
    }
    else {
      iVar5 = strcmp(pgVar20,"mt32");
      if ((iVar5 == 0) || (iVar5 = strcmp(pgVar20,"cm32l"), iVar5 == 0)) {
        bVar31 = false;
        goto LAB_0010955d;
      }
      bVar31 = loadMachineROMs(&service,pcVar11,romDir,pgVar20,true);
    }
    g_dir_close(romDir);
    g_free(pcVar11);
    if (bVar31 != false) {
      mt32emu_set_stereo_output_samplerate(service.c,(double)local_668.sampleRate);
      mt32emu_set_samplerate_conversion_quality(service.c,local_668.srcQuality);
      mt32emu_set_partial_count(service.c,local_668.partialCount);
      mt32emu_set_analog_output_mode(service.c,local_668.analogOutputMode);
      mt32emu_select_renderer_type(service.c,local_668.rendererType);
      mVar8 = mt32emu_open_synth(service.c);
      if (mVar8 == MT32EMU_RC_OK) {
        mt32emu_set_dac_input_mode(service.c,local_668.dacInputMode);
        if (local_668.niceAmpRamp == 0) {
          mt32emu_set_nice_amp_ramp_enabled(service.c,MT32EMU_BOOL_FALSE);
        }
        if (local_668.nicePanning != 0) {
          mt32emu_set_nice_panning_enabled(service.c,MT32EMU_BOOL_TRUE);
        }
        if (local_668.nicePartialMixing != 0) {
          mt32emu_set_nice_partial_mixing_enabled(service.c,MT32EMU_BOOL_TRUE);
        }
        local_668.sampleRate = mt32emu_get_actual_stereo_output_samplerate(service.c);
        printf("Using output sample rate %d Hz\n",(ulong)(uint)local_668.sampleRate);
        pcVar11 = local_698;
        sVar15 = strlen(local_698);
        pcVar12 = (char *)g_filename_to_utf8(pcVar11,sVar15,0,0,0);
        sVar15 = strlen(pcVar12);
        pcVar11 = (char *)g_locale_from_utf8(pcVar12,sVar15,0,0,0);
        if ((local_668.force == 0) && (iVar5 = g_file_test(local_698,0x10), iVar5 != 0)) {
          pFVar18 = (FILE *)0x0;
          fprintf(_stderr,"Destination file \'%s\' exists.\n",pcVar11);
        }
        else {
          pFVar18 = fopen(pcVar11,"wb");
        }
        cVar19 = clock();
        if (pFVar18 == (FILE *)0x0) {
          fprintf(_stderr,"Error opening file \'%s\' for writing.\n",pcVar11);
        }
        else {
          local_590 = cVar19;
          local_5a0 = pcVar11;
          bVar31 = true;
          local_5c8 = pFVar18;
          if (local_668.rawChannelCount < 1) {
            uVar6 = (uint)(local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) * 0x10
                    + 0x10;
            uVar25 = uVar6 >> 2;
            iVar5 = uVar25 * local_668.sampleRate;
            rom_info.control_rom_sha1_digest._0_4_ = 0x10;
            rom_info.pcm_rom_description._4_4_ = 0x61746164;
            rom_info.pcm_rom_sha1_digest._0_4_ = 0;
            rom_info.control_rom_id = (char *)0x46464952;
            rom_info.control_rom_description._0_4_ = 0x45564157;
            rom_info.control_rom_description._4_4_ = 0x20746d66;
            rom_info.control_rom_sha1_digest._5_3_ = 0x200;
            rom_info.control_rom_sha1_digest._4_1_ =
                 (local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) * '\x02' +
                 '\x01';
            rom_info.pcm_rom_id._0_1_ = (undefined1)local_668.sampleRate;
            rom_info.pcm_rom_id._1_1_ = (undefined1)((uint)local_668.sampleRate >> 8);
            rom_info.pcm_rom_id._2_1_ = (undefined1)((uint)local_668.sampleRate >> 0x10);
            rom_info.pcm_rom_id._3_1_ = (undefined1)((uint)local_668.sampleRate >> 0x18);
            rom_info.pcm_rom_id._4_1_ = (undefined1)iVar5;
            rom_info.pcm_rom_id._5_1_ = (undefined1)((uint)iVar5 >> 8);
            rom_info.pcm_rom_id._6_1_ = (undefined1)((uint)iVar5 >> 0x10);
            rom_info.pcm_rom_id._7_1_ = (undefined1)((uint)iVar5 >> 0x18);
            rom_info.pcm_rom_description._0_1_ = (undefined1)uVar25;
            rom_info.pcm_rom_description._1_1_ = 0;
            rom_info.pcm_rom_description._2_1_ = (undefined1)uVar6;
            rom_info.pcm_rom_description._3_1_ = 0;
            sVar15 = fwrite(&rom_info,1,0x2c,pFVar18);
            pcVar11 = local_5a0;
            if (sVar15 == 0x2c) {
              bVar31 = 0 < local_668.rawChannelCount;
              goto LAB_001099f9;
            }
            fprintf(_stderr,"Error writing WAVE header to \'%s\'\n",local_5a0);
          }
          else {
LAB_001099f9:
            rom_info.pcm_rom_description._0_1_ = 0;
            rom_info.pcm_rom_description._1_1_ = 0;
            rom_info.pcm_rom_description._2_1_ = 0;
            rom_info.pcm_rom_description._3_1_ = 0;
            rom_info.pcm_rom_description._4_4_ = 0;
            rom_info.pcm_rom_sha1_digest._0_4_ = 0;
            rom_info.pcm_rom_sha1_digest._4_4_ = 0;
            rom_info.control_rom_sha1_digest._0_4_ = 0;
            rom_info.control_rom_sha1_digest._4_4_ = 0;
            rom_info.pcm_rom_id._0_1_ = 0;
            rom_info.pcm_rom_id._1_1_ = 0;
            rom_info.pcm_rom_id._2_1_ = 0;
            rom_info.pcm_rom_id._3_1_ = 0;
            rom_info.pcm_rom_id._4_1_ = 0;
            rom_info.pcm_rom_id._5_1_ = 0;
            rom_info.pcm_rom_id._6_1_ = 0;
            rom_info.pcm_rom_id._7_1_ = 0;
            rom_info.control_rom_id = (char *)0x0;
            rom_info.control_rom_description._0_4_ = 0;
            rom_info.control_rom_description._4_4_ = 0;
            uVar30 = (ulong)local_668.bufferFrameCount;
            if (bVar31) {
              bVar31 = local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32;
              for (lVar27 = 1; lVar27 != 7; lVar27 = lVar27 + 1) {
                pcVar11 = (char *)operator_new__(uVar30 << bVar31 + 1);
                (&rom_info.control_rom_id)[lVar27] = pcVar11;
              }
            }
            else {
              if (local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
                rom_info.control_rom_id =
                     (char *)operator_new__((ulong)(local_668.bufferFrameCount * 2) << 2);
              }
              else {
                rom_info.control_rom_id =
                     (char *)operator_new__((ulong)(local_668.bufferFrameCount * 2) * 2);
              }
            }
            local_598 = pcVar12;
            local_5c0 = local_668.inputFilenames;
            while (pcVar12 = local_598, pcVar11 = *local_5c0, pcVar11 != (char *)0x0) {
              sVar15 = strlen(pcVar11);
              pcVar11 = (char *)g_filename_to_utf8(pcVar11,sVar15,0,0,0);
              sVar15 = strlen(pcVar11);
              local_588 = pcVar11;
              local_670 = g_locale_from_utf8(pcVar11,sVar15,0,0);
              pgVar20 = local_5c0[1];
              rawStreams = (gchar **)0x0;
              deprecatedSysexFile = (gchar *)0x0;
              local_690 = (char **)0x0;
              g_file_get_contents(*local_5c0,&rawStreams,&deprecatedSysexFile);
              ppgVar14 = rawStreams;
              pgVar3 = deprecatedSysexFile;
              if (local_690 == (char **)0x0) {
                if (*(char *)rawStreams == -0x10) {
                  pgVar20 = (gchar *)0xffffffffffffffff;
                  for (pgVar28 = (gchar *)0x0; pgVar3 != pgVar28; pgVar28 = pgVar28 + 1) {
                    cVar1 = *(char *)((long)ppgVar14 + (long)pgVar28);
                    if (cVar1 == -9) {
                      pcVar11 = 
                      "Ended a sysex message without a start byte - sysex file \'%s\' may be in an unsupported format.\n"
                      ;
                      pgVar4 = (gchar *)0xffffffffffffffff;
                      if (pgVar20 == (gchar *)0xffffffffffffffff) goto LAB_00109c43;
                      MT32Emu::Service::playSysexNow
                                (&service,(Bit8u *)((long)ppgVar14 + (long)pgVar20),
                                 ((int)pgVar28 - (int)pgVar20) + 1);
                      pgVar20 = (gchar *)0xffffffffffffffff;
                    }
                    else if ((cVar1 == -0x10) &&
                            (pcVar11 = 
                             "Started a new sysex message before the last finished - sysex file \'%s\' may be in an unsupported format.\n"
                            , bVar31 = pgVar20 != (gchar *)0xffffffffffffffff, pgVar20 = pgVar28,
                            pgVar4 = pgVar28, bVar31)) {
LAB_00109c43:
                      pgVar20 = pgVar4;
                      fprintf(_stderr,pcVar11,local_670);
                    }
                  }
                }
                else {
                  smf = smf_load_from_memory(rawStreams,(int)deprecatedSysexFile);
                  if (smf != (smf_t *)0x0) {
                    if (local_668.quiet == 0) {
                      pcVar11 = smf_decode(smf);
                      fprintf(_stdout,"%s.\n",pcVar11);
                      free(pcVar11);
                    }
                    if (smf->number_of_tracks < 1) {
                      __assert_fail("smf->number_of_tracks >= 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/src/mt32emu-smf2wav.cpp"
                                    ,0x32e,
                                    "bool playFile(const gchar *, const gchar *, const Options &, State &)"
                                   );
                    }
                    smf_rewind(smf);
                    uVar30 = 0;
LAB_00109cc9:
                    local_6d0 = (Bit8u *)0x0;
                    BVar29 = 0;
LAB_00109cd5:
                    event = smf_get_next_event(smf);
                    if (event == (smf_event_t *)0x0) {
LAB_00109fd6:
                      flushSilence(MIDI_ENDED,&local_668,(State *)&rom_info);
                      if (local_668.sendAllNotesOff != 0) {
                        uVar6 = 0;
                        iVar5 = 0x10;
                        while (bVar31 = iVar5 != 0, iVar5 = iVar5 + -1, bVar31) {
                          MT32Emu::Service::playMsg(&service,uVar6 | 0x40b0);
                          MT32Emu::Service::playMsg(&service,uVar6 | 0x7bb0);
                          uVar6 = uVar6 + 1;
                        }
                      }
                      if ((pgVar20 == (gchar *)0x0) && (local_668.renderMinFrames != 0)) {
                        render(local_668.renderMinFrames,&local_668,(State *)&rom_info);
                      }
                      if (local_668.waitForLA32 != 0) {
                        while ((local_668.renderMaxFrames != 0 &&
                               (bVar31 = MT32Emu::Service::hasActivePartials(&service), bVar31))) {
                          render(1,&local_668,(State *)&rom_info);
                        }
                        flushSilence(LA32_INACTIVE,&local_668,(State *)&rom_info);
                        if (local_668.waitForReverb != 0) {
                          uVar6 = local_668.bufferFrameCount;
                          if (0x1fff < local_668.bufferFrameCount) {
                            uVar6 = 0x2000;
                          }
                          while ((local_668.renderMaxFrames != 0 &&
                                 (bVar31 = MT32Emu::Service::isActive(&service), bVar31))) {
                            uVar25 = local_668.renderMaxFrames;
                            if (uVar6 <= local_668.renderMaxFrames) {
                              uVar25 = uVar6;
                            }
                            render(uVar25,&local_668,(State *)&rom_info);
                          }
                        }
                      }
                      MT32Emu::Service::isActive(&service);
                      if (local_6d0 != (Bit8u *)0x0) {
                        operator_delete__(local_6d0);
                      }
                      smf_delete(smf);
                      goto LAB_0010a15e;
                    }
                    if (event->track->track_number < 0) {
                      __assert_fail("event->track->track_number >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/src/mt32emu-smf2wav.cpp"
                                    ,0x2a9,"void playSMF(smf_t *, const Options &, State &)");
                    }
                    uVar22 = (ulong)((double)local_668.sampleRate * event->time_seconds);
                    uVar6 = (int)uVar22 - (int)uVar30;
                    if (uVar22 <= uVar30) {
                      uVar6 = 1;
                    }
                    uVar25 = local_668.renderMaxFrames;
                    if (uVar6 <= local_668.renderMaxFrames) {
                      uVar25 = uVar6;
                    }
                    render(uVar25,&local_668,(State *)&rom_info);
                    if (local_668.renderMaxFrames == 0) goto LAB_00109fd6;
                    iVar5 = smf_event_is_metadata(event);
                    uVar30 = uVar30 + uVar25;
                    if (iVar5 != 0) {
                      pcVar11 = smf_event_decode(event);
                      if ((pcVar11 != (char *)0x0) && (local_668.quiet == 0)) {
                        fprintf(_stdout,"Metadata: %s\n",pcVar11);
                      }
                      goto LAB_00109cd5;
                    }
                    iVar5 = smf_event_is_sysex(event);
                    if ((iVar5 == 0) && (iVar5 = smf_event_is_sysex_continuation(event), iVar5 == 0)
                       ) {
                      uVar6 = event->midi_buffer_length;
                      if ((int)uVar6 < 4) {
                        uVar23 = 0;
                        uVar22 = (ulong)uVar6;
                        if ((int)uVar6 < 1) {
                          uVar22 = uVar23;
                        }
                        uVar6 = 0;
                        for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
                          uVar6 = uVar6 | (uint)event->midi_buffer[uVar21] << ((byte)uVar23 & 0x1f);
                          uVar23 = (ulong)((int)uVar23 + 8);
                        }
                        MT32Emu::Service::playMsg(&service,uVar6);
                      }
                      else {
                        fprintf(_stderr,"Got message with unusual length: %d\n");
                        for (lVar27 = 0; lVar27 < event->midi_buffer_length; lVar27 = lVar27 + 1) {
                          fprintf(_stderr," %02x",(ulong)event->midi_buffer[lVar27]);
                        }
                        fputc(10,_stderr);
                      }
                      goto LAB_00109cd5;
                    }
                    iVar5 = smf_event_is_unterminated_sysex(event);
                    iVar9 = smf_event_is_sysex_continuation(event);
                    if (iVar9 == 0) {
                      if (local_6d0 != (Bit8u *)0x0) {
                        fwrite("New sysex received with an unterminated sysex pending - ignoring unterminated\n"
                               ,0x4e,1,_stderr);
                        operator_delete__(local_6d0);
                        BVar29 = 0;
                      }
                      sysex = event->midi_buffer;
                      len = event->midi_buffer_length;
LAB_00109e1e:
                      __dest = (Bit8u *)0x0;
                      local_6d0 = __dest;
                      if (iVar5 != 0) goto LAB_00109e2c;
                      bVar31 = false;
                    }
                    else {
                      if (local_6d0 == (Bit8u *)0x0) {
                        fwrite("Sysex continuation received without preceding unterminated sysex - hoping for the best\n"
                               ,0x57,1,_stderr);
                        sysex = event->midi_buffer + 1;
                        len = event->midi_buffer_length - 1;
                        goto LAB_00109e1e;
                      }
                      sysex = event->midi_buffer + 1;
                      len = event->midi_buffer_length - 1;
LAB_00109e2c:
                      BVar26 = len + BVar29;
                      BVar10 = 0xffffffff;
                      if (-1 < (int)BVar26) {
                        BVar10 = BVar26;
                      }
                      __dest = (Bit8u *)operator_new__((long)(int)BVar10);
                      if (local_6d0 != (Bit8u *)0x0) {
                        memcpy(__dest,local_6d0,(long)(int)BVar29);
                        operator_delete__(local_6d0);
                      }
                      memcpy(__dest + (int)BVar29,sysex,(long)(int)len);
                      local_6d0 = __dest;
                      BVar29 = BVar26;
                      if (iVar5 != 0) goto LAB_00109cd5;
                      bVar31 = true;
                      sysex = __dest;
                      len = BVar26;
                    }
                    MT32Emu::Service::playSysex(&service,sysex,len);
                    local_6d0 = __dest;
                    if (bVar31) goto code_r0x00109ef5;
                    goto LAB_00109cd5;
                  }
                  fprintf(_stderr,"Error parsing SMF file \'%s\'.\n",local_670);
                }
              }
              else {
                fprintf(_stderr,"Error reading file \'%s\': %s\n",local_670);
                g_error_free(local_690);
              }
LAB_0010a15e:
              g_free(local_670);
              local_5c0 = local_5c0 + 1;
              g_free(local_588);
            }
            if (local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
              if (rom_info.control_rom_id != (char *)0x0) {
                operator_delete__(rom_info.control_rom_id);
              }
              for (lVar27 = 1; lVar27 != 7; lVar27 = lVar27 + 1) {
                if ((&rom_info.control_rom_id)[lVar27] != (char *)0x0) {
                  operator_delete__((&rom_info.control_rom_id)[lVar27]);
                }
              }
            }
            else {
              lVar27 = 1;
              if (rom_info.control_rom_id != (char *)0x0) {
                operator_delete__(rom_info.control_rom_id);
              }
              for (; lVar27 != 7; lVar27 = lVar27 + 1) {
                if ((&rom_info.control_rom_id)[lVar27] != (char *)0x0) {
                  operator_delete__((&rom_info.control_rom_id)[lVar27]);
                }
              }
            }
            pFVar18 = local_5c8;
            pcVar11 = local_5a0;
            if (local_668.rawChannelCount == 0) {
              uVar6 = 0 << (local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32 | 2U);
              iVar5 = fseek(local_5c8,4,0);
              if (iVar5 == 0) {
                uVar25 = uVar6 + 0x1c;
                iVar5 = fputc(uVar25 & 0xfc,pFVar18);
                if ((((((iVar5 != -1) && (iVar5 = fputc(uVar25 >> 8 & 0xff,pFVar18), iVar5 != -1))
                      && (iVar5 = fputc(uVar25 >> 0x10 & 0xff,pFVar18), iVar5 != -1)) &&
                     ((iVar5 = fputc(uVar25 >> 0x18,pFVar18), iVar5 != -1 &&
                      (iVar5 = fseek(pFVar18,0x28,0), iVar5 == 0)))) &&
                    ((iVar5 = fputc(uVar6 & 0xfc,pFVar18), iVar5 != -1 &&
                     ((iVar5 = fputc(uVar6 >> 8 & 0xff,pFVar18), iVar5 != -1 &&
                      (iVar5 = fputc(uVar6 >> 0x10 & 0xff,pFVar18), iVar5 != -1)))))) &&
                   (iVar5 = fputc(uVar6 >> 0x18,pFVar18), pcVar11 = local_5a0, iVar5 != -1))
                goto LAB_0010a363;
              }
              fwrite("Error writing final sizes to WAVE header\n",0x29,1,_stderr);
              pcVar11 = local_5a0;
            }
          }
LAB_0010a363:
          fclose(local_5c8);
          cVar19 = clock();
          printf("Elapsed time: %f sec\n",SUB84((double)((float)(cVar19 - local_590) / 1e+06),0));
        }
        g_free(pcVar11);
        g_free(pcVar12);
      }
      else {
        fwrite("Error opening MT32Emu synthesizer.\n",0x23,1,_stderr);
      }
      MT32Emu::Service::freeContext(&service);
      if (local_668.outputFilename == (char *)0x0) {
        operator_delete__(local_698);
      }
      local_6b4 = 0;
      freeOptions(&local_668);
      goto LAB_0010a424;
    }
  }
  MT32Emu::Service::freeContext(&service);
  if (local_668.outputFilename == (char *)0x0) {
    operator_delete__(local_698);
  }
  freeOptions(&local_668);
LAB_0010a424:
  MT32Emu::Service::~Service(&service);
  return local_6b4;
code_r0x00109ef5:
  local_6d0 = (Bit8u *)0x0;
  BVar29 = 0;
  if (__dest != (Bit8u *)0x0) goto LAB_00109fc9;
  goto LAB_00109cd5;
LAB_00109fc9:
  operator_delete__(__dest);
  goto LAB_00109cc9;
}

Assistant:

int main(int argc, char *argv[]) {
	Options options;
	MT32Emu::Service service;
	setlocale(LC_ALL, "");
#ifdef BUILD_MT32EMU_VERSION
	const char *mt32emuVersion = BUILD_MT32EMU_VERSION;
#else
	const char *mt32emuVersion = service.getLibraryVersionString();
#endif
	printf("Munt MT32Emu MIDI to Wave Conversion Utility. Version %s\n", MT32EMU_SMF2WAV_VERSION);
	printf("  Copyright (C) 2009, 2011 Jerome Fisher <re_munt@kingguppy.com>\n");
	printf("  Copyright (C) 2012-2022 Jerome Fisher, Sergey V. Mikayev\n");
	printf("Using Munt MT32Emu Library Version %s, libsmf Version %s (with modifications)\n", mt32emuVersion, smf_get_version());
	if (!parseOptions(argc, argv, &options)) {
		return -1;
	}
	gchar *outputFilename;
	if (options.outputFilename != NULL) {
		outputFilename = options.outputFilename;
	} else {
		gchar *lastInputFilename = options.inputFilenames[g_strv_length(options.inputFilenames) - 1];
		size_t allocLen = strlen(lastInputFilename) + 5;
		outputFilename = new gchar[allocLen];
		if(outputFilename == NULL) {
			fprintf(stderr, "Error allocating %lu bytes for destination filename.\n", (unsigned long)allocLen);
			return -1;
		}
		if (options.rawChannelCount > 0) {
			sprintf(outputFilename, "%s.raw", lastInputFilename);
		} else {
			sprintf(outputFilename, "%s.wav", lastInputFilename);
		}
	}

	service.createContext();
	if (!loadROMs(service, options)) {
		service.freeContext();

		if (options.outputFilename == NULL && outputFilename != NULL) {
			delete[] outputFilename;
		}
		freeOptions(&options);
		return 1;
	}
	service.setStereoOutputSampleRate(options.sampleRate);
	service.setSamplerateConversionQuality(options.srcQuality);
	service.setPartialCount(options.partialCount);
	service.setAnalogOutputMode(options.analogOutputMode);
	service.selectRendererType(options.rendererType);
	if (service.openSynth() == MT32EMU_RC_OK) {
		service.setDACInputMode(options.dacInputMode);
		if (!options.niceAmpRamp) {
			service.setNiceAmpRampEnabled(false);
		}
		if (options.nicePanning) {
			service.setNicePanningEnabled(true);
		}
		if (options.nicePartialMixing) {
			service.setNicePartialMixingEnabled(true);
		}
		options.sampleRate = service.getActualStereoOutputSamplerate();
		printf("Using output sample rate %d Hz\n", options.sampleRate);

		char *outputFilenameUtf8 = g_filename_to_utf8(outputFilename, strlen(outputFilename), NULL, NULL, NULL);
		char *outputFilenameLocale = g_locale_from_utf8(outputFilenameUtf8, strlen(outputFilenameUtf8), NULL, NULL, NULL);

		FILE *outputFile;
		bool outputFileExists = false;
		if (!options.force) {
			// FIXME: Lame way of avoiding overwriting an existing file
			// (since it could theoretically be created between us testing and
			// opening for writing)
			if (g_file_test(outputFilename, G_FILE_TEST_EXISTS)) {
				outputFileExists = true;
			}
		}
		if (outputFileExists) {
			fprintf(stderr, "Destination file '%s' exists.\n", outputFilenameLocale);
			outputFile = NULL;
		} else {
#ifdef _MSC_VER
			fopen_s(&outputFile, outputFilenameLocale, "wb");
#else
			outputFile = fopen(outputFilenameLocale, "wb");
#endif
		}

		clock_t startTime = clock();

		if (outputFile != NULL) {
			if (options.rawChannelCount > 0 || writeWAVEHeader(outputFile, options.sampleRate, options.outputSampleFormat)) {
				State state = {NULL, {NULL, NULL, NULL, NULL, NULL, NULL}, service, outputFile, false, false, 0, 0, 0};
				state.outputFile = outputFile;
				if (options.rawChannelCount > 0) {
					for (int i = 0; i < 6; i++) {
						if (options.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
							state.rawSampleBuffer[i] = new float[options.bufferFrameCount];
						} else {
							state.rawSampleBuffer[i] = new MT32Emu::Bit16s[options.bufferFrameCount];
						}
					}
				} else {
					if (options.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
						state.stereoSampleBuffer = new float[options.bufferFrameCount * 2];
					} else {
						state.stereoSampleBuffer = new MT32Emu::Bit16s[options.bufferFrameCount * 2];
					}
				}
				gchar **inputFilename = options.inputFilenames;
				while (*inputFilename != NULL) {
					char *inputFilenameUtf8 = g_filename_to_utf8(*inputFilename, strlen(*inputFilename), NULL, NULL, NULL);
					char *inputFilenameLocale = g_locale_from_utf8(inputFilenameUtf8, strlen(inputFilenameUtf8), NULL, NULL, NULL);
					state.lastInputFile = *(inputFilename + 1) == NULL; // FIXME: This should actually be true if all subsequent files are sysex
					playFile(*inputFilename, inputFilenameLocale, options, state);
					inputFilename++;
					g_free(inputFilenameLocale);
					g_free(inputFilenameUtf8);
				}
				if (options.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
					delete[] static_cast<float *>(state.stereoSampleBuffer);
					for (int i = 0; i < 6; i++) {
						delete[] static_cast<float *>(state.rawSampleBuffer[i]);
					}
				} else {
					delete[] static_cast<MT32Emu::Bit16s *>(state.stereoSampleBuffer);
					for (int i = 0; i < 6; i++) {
						delete[] static_cast<MT32Emu::Bit16s *>(state.rawSampleBuffer[i]);
					}
				}
				if (options.rawChannelCount == 0 && !fillWAVESizes(outputFile, state.writtenFrames, options.outputSampleFormat)) {
					fprintf(stderr, "Error writing final sizes to WAVE header\n");
				}
			} else {
				fprintf(stderr, "Error writing WAVE header to '%s'\n", outputFilenameLocale);
			}
			fclose(outputFile);
			printf("Elapsed time: %f sec\n", float(clock() - startTime) / CLOCKS_PER_SEC);
		} else {
			fprintf(stderr, "Error opening file '%s' for writing.\n", outputFilenameLocale);
		}
		g_free(outputFilenameLocale);
		g_free(outputFilenameUtf8);
	} else {
		fprintf(stderr, "Error opening MT32Emu synthesizer.\n");
	}
	service.freeContext();

	if(options.outputFilename == NULL && outputFilename != NULL) {
		delete[] outputFilename;
	}
	freeOptions(&options);
	return 0;
}